

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ellswift_decode(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *ell64)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  secp256k1_ge p;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_ge *in_stack_ffffffffffffff18;
  secp256k1_fe *in_stack_ffffffffffffff20;
  secp256k1_fe *in_stack_ffffffffffffff50;
  secp256k1_fe *in_stack_ffffffffffffff58;
  secp256k1_ge *in_stack_ffffffffffffff60;
  int local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ellswift/main_impl.h"
            ,0x1ec,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else {
    secp256k1_fe_set_b32_mod(in_stack_ffffffffffffff20,(uchar *)in_stack_ffffffffffffff18);
    secp256k1_fe_set_b32_mod(in_stack_ffffffffffffff20,(uchar *)in_stack_ffffffffffffff18);
    secp256k1_fe_normalize_var((secp256k1_fe *)0x10eb04);
    secp256k1_ellswift_swiftec_var
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    secp256k1_pubkey_save((secp256k1_pubkey *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_ellswift_decode(const secp256k1_context *ctx, secp256k1_pubkey *pubkey, const unsigned char *ell64) {
    secp256k1_fe u, t;
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(ell64 != NULL);

    secp256k1_fe_set_b32_mod(&u, ell64);
    secp256k1_fe_set_b32_mod(&t, ell64 + 32);
    secp256k1_fe_normalize_var(&t);
    secp256k1_ellswift_swiftec_var(&p, &u, &t);
    secp256k1_pubkey_save(pubkey, &p);
    return 1;
}